

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

void __thiscall draco::Options::SetVector<float>(Options *this,string *name,float *vec,int num_dims)

{
  mapped_type *pmVar1;
  ulong uVar2;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  string *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_40 = &this->options_;
  local_38 = name;
  if (0 < num_dims) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__cxx11::string::append((char *)&local_60);
      }
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_80,vsnprintf,0x3a,"%f",(double)vec[uVar2]);
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)num_dims != uVar2);
  }
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_40,local_38);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void Options::SetVector(const std::string &name, const DataTypeT *vec,
                        int num_dims) {
  std::string out;
  for (int i = 0; i < num_dims; ++i) {
    if (i > 0) {
      out += " ";
    }

// GNU STL on android doesn't include a proper std::to_string, but the libc++
// version does
#if defined(ANDROID) && !defined(_LIBCPP_VERSION)
    out += to_string(vec[i]);
#else
    out += std::to_string(vec[i]);
#endif
  }
  options_[name] = out;
}